

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

bool __thiscall cmFindPackageCommand::CheckVersion(cmFindPackageCommand *this,string *config_file)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string version;
  string version_file;
  string version_file_base;
  ConfigFileInfo configFileInfo;
  string local_f8;
  string local_d8;
  long *local_b8;
  pointer local_b0;
  long local_a8 [2];
  size_type local_98;
  undefined1 local_90 [32];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"unknown","");
  std::__cxx11::string::rfind((char)config_file,0x2e);
  std::__cxx11::string::substr((ulong)&local_b8,(ulong)config_file);
  local_90._0_8_ = local_b0;
  local_90._8_8_ = local_b8;
  local_90._16_8_ = 0xe;
  local_90._24_8_ = "-version.cmake";
  views._M_len = 2;
  views._M_array = (iterator)local_90;
  cmCatViews_abi_cxx11_(&local_d8,views);
  bVar1 = cmsys::SystemTools::FileExists(&local_d8,true);
  if (!bVar1) {
    bVar2 = false;
  }
  else {
    bVar2 = CheckVersionFile(this,&local_d8,&local_f8);
  }
  bVar1 = bVar1;
  local_90._0_8_ = local_b0;
  local_90._8_8_ = local_b8;
  local_90._16_8_ = 0xd;
  local_90._24_8_ = "Version.cmake";
  views_00._M_len = 2;
  views_00._M_array = (iterator)local_90;
  cmCatViews_abi_cxx11_(&local_50,views_00);
  std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (!bVar1) {
    bVar3 = cmsys::SystemTools::FileExists(&local_d8,true);
    if (bVar3) {
      bVar2 = CheckVersionFile(this,&local_d8,&local_f8);
      bVar1 = true;
    }
  }
  local_98 = (this->Version)._M_string_length;
  local_90._8_8_ = (char *)0x0;
  local_90._16_8_ = local_90._16_8_ & 0xffffffffffffff00;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_90._0_8_ = local_90 + 0x10;
  local_70._M_p = (pointer)&local_60;
  std::__cxx11::string::_M_assign((string *)local_90);
  std::__cxx11::string::_M_assign((string *)&local_70);
  std::
  vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
  ::emplace_back<cmFindPackageCommand::ConfigFileInfo>
            (&this->ConsideredConfigs,(ConfigFileInfo *)local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,
                    CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  bVar3 = true;
  if (local_98 != 0) {
    bVar3 = bVar2;
  }
  if (bVar1) {
    bVar3 = bVar2;
  }
  return bVar3;
}

Assistant:

bool cmFindPackageCommand::CheckVersion(std::string const& config_file)
{
  bool result = false; // by default, assume the version is not ok.
  bool haveResult = false;
  std::string version = "unknown";

  // Get the filename without the .cmake extension.
  std::string::size_type pos = config_file.rfind('.');
  std::string version_file_base = config_file.substr(0, pos);

  // Look for foo-config-version.cmake
  std::string version_file = cmStrCat(version_file_base, "-version.cmake");
  if (!haveResult && cmSystemTools::FileExists(version_file, true)) {
    result = this->CheckVersionFile(version_file, version);
    haveResult = true;
  }

  // Look for fooConfigVersion.cmake
  version_file = cmStrCat(version_file_base, "Version.cmake");
  if (!haveResult && cmSystemTools::FileExists(version_file, true)) {
    result = this->CheckVersionFile(version_file, version);
    haveResult = true;
  }

  // If no version was requested a versionless package is acceptable.
  if (!haveResult && this->Version.empty()) {
    result = true;
  }

  ConfigFileInfo configFileInfo;
  configFileInfo.filename = config_file;
  configFileInfo.version = version;
  this->ConsideredConfigs.push_back(std::move(configFileInfo));

  return result;
}